

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
               (void)

{
  uint *__args_2;
  pointer ppVar1;
  pointer puVar2;
  _Base_ptr p_Var3;
  Column_settings *pCVar4;
  bool bVar5;
  Column_zp_settings *this;
  _Rb_tree_node_base *p_Var6;
  undefined1 *puVar7;
  pointer __args;
  undefined4 local_5b4;
  undefined4 *local_5b0;
  _Base_ptr local_5a8;
  undefined **local_5a0;
  ulong local_598;
  shared_count sStack_590;
  undefined4 **local_588;
  undefined8 local_580;
  uint local_578 [2];
  undefined8 *local_570;
  _Base_ptr *local_568;
  undefined1 local_560 [8];
  undefined8 local_558;
  shared_count sStack_550;
  char *local_548;
  char *local_540;
  undefined **local_538;
  char *local_530;
  undefined8 *local_528;
  char *local_520;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
              *)&m.matrix_,&columns,this);
  ppVar1 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_RU_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      m.matrix_.super_RU_pairing_option.barcode_.
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = m.matrix_.super_RU_pairing_option.barcode_.
             super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __args_2 = &__args->death;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,&__args->dim,&__args->birth,__args_2);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,&__args->dim,&__args->birth,__args_2);
      local_578[0] = *__args_2;
      local_580._0_4_ = __args->dim;
      local_580._4_4_ = __args->birth;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_580,(uint *)((long)&local_580 + 4),local_578);
      __args = __args + 1;
    } while (__args != m.matrix_.super_RU_pairing_option.barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var3 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x574);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5a8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_5b0 = &local_5b4;
  local_5b4 = 0;
  local_560[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_568 = &local_5a8;
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_598 = local_598 & 0xffffffffffffff00;
  local_588 = &local_5b0;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x575);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 0;
  local_560[0] = *(int *)&p_Var3[1].field_0x4 == 0;
  local_5a8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x577);
  local_5a8 = p_Var3 + 1;
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 0xffffffff;
  local_560[0] = local_5a8->_M_color == ~_S_red;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x579);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 0;
  local_560[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_5a8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0x57a);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 1;
  local_560[0] = *(int *)&p_Var6[1].field_0x4 == 1;
  local_5a8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x57b);
  local_5a8 = p_Var6 + 1;
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 3;
  local_560[0] = local_5a8->_M_color == 3;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x57d);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 0;
  local_560[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_5a8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x57e);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 2;
  local_560[0] = *(int *)&p_Var6[1].field_0x4 == 2;
  local_5a8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x57f);
  local_5a8 = p_Var6 + 1;
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 4;
  local_560[0] = local_5a8->_M_color == 4;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_330,0x581);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 0;
  local_560[0] = *(int *)&p_Var6[1]._M_parent == 0;
  local_5a8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x582);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 7;
  local_560[0] = *(int *)&p_Var6[1].field_0x4 == 7;
  local_5a8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x583);
  local_5a8 = p_Var6 + 1;
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 8;
  local_560[0] = local_5a8->_M_color == 8;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_390,0x585);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 1;
  local_560[0] = *(int *)&p_Var6[1]._M_parent == 1;
  local_5a8 = (_Base_ptr)&p_Var6[1]._M_parent;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x586);
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 5;
  local_560[0] = *(int *)&p_Var6[1].field_0x4 == 5;
  local_5a8 = (_Base_ptr)&p_Var6[1].field_0x4;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_550);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x587);
  local_5a8 = p_Var6 + 1;
  local_530 = (char *)((ulong)local_530 & 0xffffffffffffff00);
  local_538 = &PTR__lazy_ostream_00260dd0;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  local_520 = "";
  local_5b4 = 6;
  local_560[0] = local_5a8->_M_color == 6;
  local_558 = 0;
  sStack_550.pi_ = (sp_counted_base *)0x0;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_540 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260d90;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = &local_5a8;
  local_5b0 = &local_5b4;
  local_598 = local_598 & 0xffffffffffffff00;
  local_5a0 = &PTR__lazy_ostream_00260d90;
  sStack_590.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = &local_5b0;
  boost::test_tools::tt_detail::report_assertion
            (local_560,&local_538,&local_548,0x587,1,2,2,"std::get<2>(*it)",&local_580,"6",
             &local_5a0);
  boost::detail::shared_count::~shared_count(&sStack_550);
  puVar7 = (undefined1 *)std::_Rb_tree_increment(p_Var6);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f0,0x589);
  local_5a0 = (undefined **)
              CONCAT71(local_5a0._1_7_,
                       (_Rb_tree_header *)puVar7 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_598 = 0;
  sStack_590.pi_ = (sp_counted_base *)0x0;
  local_538 = (undefined **)0x21ce44;
  local_530 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260fd0;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_568 = (_Base_ptr *)&local_538;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_590);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar5 = false;
  }
  local_5a0 = (undefined **)CONCAT71(local_5a0._1_7_,bVar5);
  local_598 = 0;
  sStack_590.pi_ = (sp_counted_base *)0x0;
  local_538 = (undefined **)0x21ce56;
  local_530 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260fd0;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_568 = (_Base_ptr *)&local_538;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_590);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_448 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_450,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar5 = false;
  }
  local_5a0 = (undefined **)CONCAT71(local_5a0._1_7_,bVar5);
  local_598 = 0;
  sStack_590.pi_ = (sp_counted_base *)0x0;
  local_538 = (undefined **)0x21ce65;
  local_530 = "";
  local_578[0] = local_578[0] & 0xffffff00;
  local_580 = &PTR__lazy_ostream_00260fd0;
  local_570 = &boost::unit_test::lazy_ostream::inst;
  local_568 = (_Base_ptr *)&local_538;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_590);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
  ::reset(&m.matrix_,m.colSettings_);
  pCVar4 = m.colSettings_;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)
               &(m.colSettings_)->entryConstructor);
    puVar2 = (pCVar4->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pCVar4->operators).inverse_.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
  }
  operator_delete(pCVar4,0x58);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
  ::~RU_matrix(&m.matrix_);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}